

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMPrint.cpp
# Opt level: O0

int main(int argC,char **argV)

{
  DOMLSOutput *pDVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  XercesDOMParser *this;
  DOMTreeErrorReporter *this_00;
  DOMPrintFilter *this_01;
  DOMConfiguration *this_02;
  LocalFileFormatTarget *this_03;
  StdOutFormatTarget *this_04;
  undefined8 uVar7;
  long *plVar8;
  long *plVar9;
  DOMException *pDVar10;
  char *pcVar11;
  code *pcVar12;
  undefined8 *puVar13;
  XMLCh *local_1350;
  OutOfMemoryException *anon_var_0_1;
  DOMLSException *e_2;
  XMLException *e_3;
  DOMXPathException *e_4;
  DOMException *e_5;
  XMLSize_t i;
  XMLSize_t nLength;
  DOMXPathResult *result;
  DOMXPathNSResolver *resolver;
  DOMElement *root;
  XMLCh *xpathStr;
  DOMDocument *doc;
  XMLFormatTarget *myFormTarget;
  DOMConfiguration *serializerConfig;
  DOMErrorHandler *myErrorHandler;
  DOMLSOutput *theOutputDesc;
  DOMLSSerializer *theSerializer;
  DOMImplementation *impl;
  XMLCh tempStr [3];
  DOMPrintFilter *myFilter;
  OutOfMemoryException *anon_var_0;
  XMLException *e;
  XMLCh errText [2048];
  uint maxChars;
  DOMException *e_1;
  bool errorsOccured;
  DOMTreeErrorReporter *errReporter;
  XercesDOMParser *parser;
  char *parm_6;
  char *parm_5;
  char *parm_4;
  char *parm_3;
  char *parm_2;
  char *parm_1;
  char *parm;
  int parmInd;
  XMLException *toCatch;
  int local_1c;
  int retval;
  char **argV_local;
  int argC_local;
  
  local_1c = 0;
  pcVar11 = (char *)0x0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (argC < 2) {
    usage();
    xercesc_4_0::XMLPlatformUtils::Terminate();
    return 1;
  }
  parm._4_4_ = 1;
  do {
    if ((argC <= parm._4_4_) || (*argV[parm._4_4_] != '-')) {
      if (parm._4_4_ + 1 == argC) {
        gXmlFile = argV[parm._4_4_];
        this = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar11)
        ;
        xercesc_4_0::XercesDOMParser::XercesDOMParser
                  (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                   (XMLGrammarPool *)0x0);
        xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)this);
        bVar2 = SUB81(this,0);
        xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar2);
        xercesc_4_0::AbstractDOMParser::setDoSchema(bVar2);
        xercesc_4_0::AbstractDOMParser::setHandleMultipleImports(bVar2);
        xercesc_4_0::AbstractDOMParser::setValidationSchemaFullChecking(bVar2);
        xercesc_4_0::AbstractDOMParser::setCreateEntityReferenceNodes
                  ((AbstractDOMParser *)this,(bool)(gDoCreate & 1));
        this_00 = (DOMTreeErrorReporter *)operator_new(0x10);
        DOMTreeErrorReporter::DOMTreeErrorReporter(this_00);
        xercesc_4_0::XercesDOMParser::setErrorHandler((ErrorHandler *)this);
        xercesc_4_0::AbstractDOMParser::parse((char *)this);
        bVar2 = DOMTreeErrorReporter::getSawErrors(this_00);
        if (bVar2) {
          local_1c = 4;
        }
        else {
          _tempStr = (DOMPrintFilter *)0x0;
          impl._4_2_ = 0;
          impl._0_4_ = 0x53004c;
          theSerializer =
               (DOMLSSerializer *)
               xercesc_4_0::DOMImplementationRegistry::getDOMImplementation((wchar16 *)&impl);
          theOutputDesc =
               (DOMLSOutput *)
               (**(code **)(*(long *)theSerializer + 0x18))
                         (theSerializer,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          myErrorHandler =
               (DOMErrorHandler *)
               (**(code **)(*(long *)theSerializer + 0x28))
                         (theSerializer,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          (*myErrorHandler->_vptr_DOMErrorHandler[6])(myErrorHandler,gOutputEncoding);
          if ((gUseFilter & 1U) != 0) {
            this_01 = (DOMPrintFilter *)operator_new(0x10);
            DOMPrintFilter::DOMPrintFilter(this_01,0x203);
            _tempStr = this_01;
            (**(code **)(*(long *)theOutputDesc + 0x20))(theOutputDesc,this_01);
          }
          this_02 = (DOMConfiguration *)operator_new(8);
          DOMPrintErrorHandler::DOMPrintErrorHandler((DOMPrintErrorHandler *)this_02);
          serializerConfig = this_02;
          myFormTarget = (XMLFormatTarget *)(**(code **)(*(long *)theOutputDesc + 0x10))();
          (*(code *)**(undefined8 **)myFormTarget)
                    (myFormTarget,&xercesc_4_0::XMLUni::fgDOMErrorHandler,serializerConfig);
          bVar3 = (**(code **)(*(long *)myFormTarget + 0x20))
                            (myFormTarget,&xercesc_4_0::XMLUni::fgDOMWRTSplitCdataSections,
                             gSplitCdataSections & 1);
          if ((bVar3 & 1) != 0) {
            (**(code **)(*(long *)myFormTarget + 8))
                      (myFormTarget,&xercesc_4_0::XMLUni::fgDOMWRTSplitCdataSections,
                       gSplitCdataSections & 1);
          }
          bVar3 = (**(code **)(*(long *)myFormTarget + 0x20))
                            (myFormTarget,&xercesc_4_0::XMLUni::fgDOMWRTDiscardDefaultContent,
                             gDiscardDefaultContent & 1);
          if ((bVar3 & 1) != 0) {
            (**(code **)(*(long *)myFormTarget + 8))
                      (myFormTarget,&xercesc_4_0::XMLUni::fgDOMWRTDiscardDefaultContent,
                       gDiscardDefaultContent & 1);
          }
          bVar3 = (**(code **)(*(long *)myFormTarget + 0x20))
                            (myFormTarget,&xercesc_4_0::XMLUni::fgDOMWRTFormatPrettyPrint,
                             gFormatPrettyPrint & 1);
          if ((bVar3 & 1) != 0) {
            (**(code **)(*(long *)myFormTarget + 8))
                      (myFormTarget,&xercesc_4_0::XMLUni::fgDOMWRTFormatPrettyPrint,
                       gFormatPrettyPrint & 1);
          }
          bVar3 = (**(code **)(*(long *)myFormTarget + 0x20))
                            (myFormTarget,&xercesc_4_0::XMLUni::fgDOMWRTBOM,gWriteBOM & 1);
          if ((bVar3 & 1) != 0) {
            (**(code **)(*(long *)myFormTarget + 8))
                      (myFormTarget,&xercesc_4_0::XMLUni::fgDOMWRTBOM,gWriteBOM & 1);
          }
          puVar13 = &xercesc_4_0::XMLUni::fgDOMXMLDeclaration;
          bVar3 = (**(code **)(*(long *)myFormTarget + 0x20))
                            (myFormTarget,&xercesc_4_0::XMLUni::fgDOMXMLDeclaration,
                             gXMLDeclaration & 1);
          if ((bVar3 & 1) != 0) {
            puVar13 = &xercesc_4_0::XMLUni::fgDOMXMLDeclaration;
            (**(code **)(*(long *)myFormTarget + 8))
                      (myFormTarget,&xercesc_4_0::XMLUni::fgDOMXMLDeclaration,gXMLDeclaration & 1);
          }
          if (goutputfile == (char *)0x0) {
            this_04 = (StdOutFormatTarget *)
                      xercesc_4_0::XMemory::operator_new((XMemory *)0x8,(ulong)puVar13);
            xercesc_4_0::StdOutFormatTarget::StdOutFormatTarget(this_04);
            doc = (DOMDocument *)this_04;
          }
          else {
            this_03 = (LocalFileFormatTarget *)
                      xercesc_4_0::XMemory::operator_new((XMemory *)0x30,(ulong)puVar13);
            xercesc_4_0::LocalFileFormatTarget::LocalFileFormatTarget
                      (this_03,goutputfile,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            doc = (DOMDocument *)this_03;
          }
          (*myErrorHandler->_vptr_DOMErrorHandler[5])(myErrorHandler,doc);
          xpathStr = (XMLCh *)xercesc_4_0::AbstractDOMParser::getDocument();
          if (gXPathExpression == (char *)0x0) {
            local_1350 = (XMLCh *)0x0;
            if (xpathStr != (XMLCh *)0x0) {
              local_1350 = xpathStr + 0xc;
            }
            (**(code **)(*(long *)theOutputDesc + 0x38))(theOutputDesc,local_1350,myErrorHandler);
          }
          else {
            root = (DOMElement *)
                   xercesc_4_0::XMLString::transcode
                             (gXPathExpression,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            uVar7 = (**(code **)(*(long *)xpathStr + 0x68))();
            plVar8 = (long *)(**(code **)(*(long *)(xpathStr + 4) + 0x18))(xpathStr + 4,uVar7);
            plVar9 = (long *)(**(code **)(*(long *)(xpathStr + 4) + 0x20))
                                       (xpathStr + 4,root,uVar7,plVar8,7,0);
            pDVar10 = (DOMException *)(**(code **)(*plVar9 + 0x68))();
            for (e_5 = (DOMException *)0x0; e_5 < pDVar10; e_5 = e_5 + 1) {
              (**(code **)(*plVar9 + 0x60))(plVar9,e_5);
              pDVar1 = theOutputDesc;
              uVar7 = (**(code **)(*plVar9 + 0x48))();
              (**(code **)(*(long *)pDVar1 + 0x38))(pDVar1,uVar7,myErrorHandler);
            }
            (**(code **)(*plVar9 + 0x70))();
            (**(code **)(*plVar8 + 0x28))();
            xercesc_4_0::XMLString::release
                      ((wchar16 **)&root,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          }
          (*myErrorHandler->_vptr_DOMErrorHandler[8])();
          (**(code **)(*(long *)theOutputDesc + 0x50))();
          if (doc != (DOMDocument *)0x0) {
            (**(code **)(*(long *)doc + 8))();
          }
          if (serializerConfig != (DOMConfiguration *)0x0) {
            (**(code **)(*(long *)serializerConfig + 8))();
          }
          if (((gUseFilter & 1U) != 0) && (_tempStr != (DOMPrintFilter *)0x0)) {
            (*(_tempStr->super_DOMLSSerializerFilter).super_DOMNodeFilter._vptr_DOMNodeFilter[1])();
          }
        }
        if (this_00 != (DOMTreeErrorReporter *)0x0) {
          (*(this_00->super_ErrorHandler)._vptr_ErrorHandler[1])();
        }
        if (this != (XercesDOMParser *)0x0) {
          (**(code **)(*(long *)this + 8))();
        }
        xercesc_4_0::XMLString::release
                  (&gOutputEncoding,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::XMLPlatformUtils::Terminate();
        argV_local._4_4_ = local_1c;
      }
      else {
        usage();
        xercesc_4_0::XMLPlatformUtils::Terminate();
        argV_local._4_4_ = 1;
      }
      return argV_local._4_4_;
    }
    iVar4 = strcmp(argV[parm._4_4_],"-?");
    if (iVar4 == 0) {
      usage();
      xercesc_4_0::XMLPlatformUtils::Terminate();
      return 2;
    }
    iVar4 = strncmp(argV[parm._4_4_],"-v=",3);
    if ((iVar4 == 0) || (iVar4 = strncmp(argV[parm._4_4_],"-V=",3), iVar4 == 0)) {
      pcVar5 = argV[parm._4_4_] + 3;
      pcVar11 = "never";
      iVar4 = strcmp(pcVar5,"never");
      if (iVar4 == 0) {
        gValScheme = Val_Never;
      }
      else {
        pcVar11 = "auto";
        iVar4 = strcmp(pcVar5,"auto");
        if (iVar4 == 0) {
          gValScheme = Val_Auto;
        }
        else {
          pcVar11 = "always";
          iVar4 = strcmp(pcVar5,"always");
          if (iVar4 != 0) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown -v= value: ");
            poVar6 = std::operator<<(poVar6,pcVar5);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            xercesc_4_0::XMLPlatformUtils::Terminate();
            return 2;
          }
          gValScheme = Val_Always;
        }
      }
    }
    else {
      pcVar11 = "-n";
      iVar4 = strcmp(argV[parm._4_4_],"-n");
      if (iVar4 != 0) {
        pcVar11 = "-N";
        iVar4 = strcmp(argV[parm._4_4_],"-N");
        if (iVar4 != 0) {
          pcVar11 = "-s";
          iVar4 = strcmp(argV[parm._4_4_],"-s");
          if (iVar4 != 0) {
            pcVar11 = "-S";
            iVar4 = strcmp(argV[parm._4_4_],"-S");
            if (iVar4 != 0) {
              pcVar11 = "-f";
              iVar4 = strcmp(argV[parm._4_4_],"-f");
              if (iVar4 != 0) {
                pcVar11 = "-F";
                iVar4 = strcmp(argV[parm._4_4_],"-F");
                if (iVar4 != 0) {
                  pcVar11 = "-e";
                  iVar4 = strcmp(argV[parm._4_4_],"-e");
                  if (iVar4 != 0) {
                    pcVar11 = "-E";
                    iVar4 = strcmp(argV[parm._4_4_],"-E");
                    if (iVar4 != 0) {
                      iVar4 = strncmp(argV[parm._4_4_],"-wenc=",6);
                      if (iVar4 == 0) {
                        pcVar11 = (char *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
                        gOutputEncoding =
                             (XMLCh *)xercesc_4_0::XMLString::transcode
                                                (argV[parm._4_4_] + 6,
                                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
                      }
                      else {
                        pcVar11 = "-wfile=";
                        iVar4 = strncmp(argV[parm._4_4_],"-wfile=",7);
                        if (iVar4 == 0) {
                          goutputfile = argV[parm._4_4_] + 7;
                        }
                        else {
                          iVar4 = strncmp(argV[parm._4_4_],"-wddc=",6);
                          if (iVar4 == 0) {
                            pcVar5 = argV[parm._4_4_] + 6;
                            pcVar11 = "on";
                            iVar4 = strcmp(pcVar5,"on");
                            if (iVar4 == 0) {
                              gDiscardDefaultContent = true;
                            }
                            else {
                              pcVar11 = "off";
                              iVar4 = strcmp(pcVar5,"off");
                              if (iVar4 != 0) {
                                poVar6 = std::operator<<((ostream *)&std::cerr,
                                                         "Unknown -wddc= value: ");
                                poVar6 = std::operator<<(poVar6,pcVar5);
                                std::ostream::operator<<
                                          (poVar6,std::endl<char,std::char_traits<char>>);
                                xercesc_4_0::XMLPlatformUtils::Terminate();
                                return 2;
                              }
                              gDiscardDefaultContent = false;
                            }
                          }
                          else {
                            iVar4 = strncmp(argV[parm._4_4_],"-wscs=",6);
                            if (iVar4 == 0) {
                              pcVar5 = argV[parm._4_4_] + 6;
                              pcVar11 = "on";
                              iVar4 = strcmp(pcVar5,"on");
                              if (iVar4 == 0) {
                                gSplitCdataSections = true;
                              }
                              else {
                                pcVar11 = "off";
                                iVar4 = strcmp(pcVar5,"off");
                                if (iVar4 != 0) {
                                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                                           "Unknown -wscs= value: ");
                                  poVar6 = std::operator<<(poVar6,pcVar5);
                                  std::ostream::operator<<
                                            (poVar6,std::endl<char,std::char_traits<char>>);
                                  xercesc_4_0::XMLPlatformUtils::Terminate();
                                  return 2;
                                }
                                gSplitCdataSections = false;
                              }
                            }
                            else {
                              iVar4 = strncmp(argV[parm._4_4_],"-wflt=",6);
                              if (iVar4 == 0) {
                                pcVar5 = argV[parm._4_4_] + 6;
                                pcVar11 = "on";
                                iVar4 = strcmp(pcVar5,"on");
                                if (iVar4 == 0) {
                                  gUseFilter = true;
                                }
                                else {
                                  pcVar11 = "off";
                                  iVar4 = strcmp(pcVar5,"off");
                                  if (iVar4 != 0) {
                                    poVar6 = std::operator<<((ostream *)&std::cerr,
                                                             "Unknown -wflt= value: ");
                                    poVar6 = std::operator<<(poVar6,pcVar5);
                                    std::ostream::operator<<
                                              (poVar6,std::endl<char,std::char_traits<char>>);
                                    xercesc_4_0::XMLPlatformUtils::Terminate();
                                    return 2;
                                  }
                                  gUseFilter = false;
                                }
                              }
                              else {
                                iVar4 = strncmp(argV[parm._4_4_],"-wfpp=",6);
                                if (iVar4 == 0) {
                                  pcVar5 = argV[parm._4_4_] + 6;
                                  pcVar11 = "on";
                                  iVar4 = strcmp(pcVar5,"on");
                                  if (iVar4 == 0) {
                                    gFormatPrettyPrint = true;
                                  }
                                  else {
                                    pcVar11 = "off";
                                    iVar4 = strcmp(pcVar5,"off");
                                    if (iVar4 != 0) {
                                      poVar6 = std::operator<<((ostream *)&std::cerr,
                                                               "Unknown -wfpp= value: ");
                                      poVar6 = std::operator<<(poVar6,pcVar5);
                                      std::ostream::operator<<
                                                (poVar6,std::endl<char,std::char_traits<char>>);
                                      xercesc_4_0::XMLPlatformUtils::Terminate();
                                      return 2;
                                    }
                                    gFormatPrettyPrint = false;
                                  }
                                }
                                else {
                                  iVar4 = strncmp(argV[parm._4_4_],"-wfdecl=",8);
                                  if (iVar4 == 0) {
                                    pcVar5 = argV[parm._4_4_] + 8;
                                    pcVar11 = "on";
                                    iVar4 = strcmp(pcVar5,"on");
                                    if (iVar4 == 0) {
                                      gXMLDeclaration = true;
                                    }
                                    else {
                                      pcVar11 = "off";
                                      iVar4 = strcmp(pcVar5,"off");
                                      if (iVar4 != 0) {
                                        poVar6 = std::operator<<((ostream *)&std::cerr,
                                                                 "Unknown -wfdecl= value: ");
                                        poVar6 = std::operator<<(poVar6,pcVar5);
                                        std::ostream::operator<<
                                                  (poVar6,std::endl<char,std::char_traits<char>>);
                                        xercesc_4_0::XMLPlatformUtils::Terminate();
                                        return 2;
                                      }
                                      gXMLDeclaration = false;
                                    }
                                  }
                                  else {
                                    iVar4 = strncmp(argV[parm._4_4_],"-wbom=",6);
                                    if (iVar4 == 0) {
                                      pcVar5 = argV[parm._4_4_] + 6;
                                      pcVar11 = "on";
                                      iVar4 = strcmp(pcVar5,"on");
                                      if (iVar4 == 0) {
                                        gWriteBOM = true;
                                      }
                                      else {
                                        pcVar11 = "off";
                                        iVar4 = strcmp(pcVar5,"off");
                                        if (iVar4 != 0) {
                                          poVar6 = std::operator<<((ostream *)&std::cerr,
                                                                   "Unknown -wbom= value: ");
                                          poVar6 = std::operator<<(poVar6,pcVar5);
                                          std::ostream::operator<<
                                                    (poVar6,std::endl<char,std::char_traits<char>>);
                                          xercesc_4_0::XMLPlatformUtils::Terminate();
                                          return 2;
                                        }
                                        gWriteBOM = false;
                                      }
                                    }
                                    else {
                                      pcVar11 = "-xpath=";
                                      iVar4 = strncmp(argV[parm._4_4_],"-xpath=",7);
                                      if (iVar4 == 0) {
                                        gXPathExpression = argV[parm._4_4_] + 7;
                                      }
                                      else {
                                        poVar6 = std::operator<<((ostream *)&std::cerr,
                                                                 "Unknown option \'");
                                        poVar6 = std::operator<<(poVar6,argV[parm._4_4_]);
                                        poVar6 = std::operator<<(poVar6,"\', ignoring it.\n");
                                        pcVar12 = std::endl<char,std::char_traits<char>>;
                                        std::ostream::operator<<
                                                  (poVar6,std::endl<char,std::char_traits<char>>);
                                        pcVar11 = (char *)pcVar12;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      goto LAB_00104e03;
                    }
                  }
                  gDoCreate = true;
                  goto LAB_00104e03;
                }
              }
              gSchemaFullChecking = true;
              goto LAB_00104e03;
            }
          }
          gDoSchema = true;
          goto LAB_00104e03;
        }
      }
      gDoNamespaces = true;
    }
LAB_00104e03:
    parm._4_4_ = parm._4_4_ + 1;
  } while( true );
}

Assistant:

int main(int argC, char* argV[])
{
    int retval = 0;

    // Initialize the XML4C2 system
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch(const XMLException &toCatch)
    {
        std::cerr << "Error during Xerces-c Initialization.\n"
             << "  Exception message:"
             << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }

    // See if non validating dom parser configuration is requested.
    int parmInd;
    for (parmInd = 1; parmInd < argC; parmInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[parmInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[parmInd], "-?"))
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 2;
        }
         else if (!strncmp(argV[parmInd], "-v=", 3)
              ||  !strncmp(argV[parmInd], "-V=", 3))
        {
            const char* const parm = &argV[parmInd][3];

            if (!strcmp(parm, "never"))
                gValScheme = XercesDOMParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                gValScheme = XercesDOMParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                gValScheme = XercesDOMParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strcmp(argV[parmInd], "-n")
              ||  !strcmp(argV[parmInd], "-N"))
        {
            gDoNamespaces = true;
        }
         else if (!strcmp(argV[parmInd], "-s")
              ||  !strcmp(argV[parmInd], "-S"))
        {
            gDoSchema = true;
        }
         else if (!strcmp(argV[parmInd], "-f")
              ||  !strcmp(argV[parmInd], "-F"))
        {
            gSchemaFullChecking = true;
        }
         else if (!strcmp(argV[parmInd], "-e")
              ||  !strcmp(argV[parmInd], "-E"))
        {
            gDoCreate = true;
        }
         else if (!strncmp(argV[parmInd], "-wenc=", 6))
        {
             // Get out the encoding name
             gOutputEncoding = XMLString::transcode( &(argV[parmInd][6]) );
        }
         else if (!strncmp(argV[parmInd], "-wfile=", 7))
        {
             goutputfile =  &(argV[parmInd][7]);
        }
         else if (!strncmp(argV[parmInd], "-wddc=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gDiscardDefaultContent = true;
            else if (!strcmp(parm, "off"))
				gDiscardDefaultContent = false;
            else
            {
                std::cerr << "Unknown -wddc= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }

        }
         else if (!strncmp(argV[parmInd], "-wscs=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gSplitCdataSections = true;
			else if (!strcmp(parm, "off"))
				gSplitCdataSections = false;
            else
            {
                std::cerr << "Unknown -wscs= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-wflt=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gUseFilter = true;
			else if (!strcmp(parm, "off"))
				gUseFilter = false;
            else
            {
                std::cerr << "Unknown -wflt= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-wfpp=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gFormatPrettyPrint = true;
			else if (!strcmp(parm, "off"))
				gFormatPrettyPrint = false;
            else
            {
                std::cerr << "Unknown -wfpp= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-wfdecl=", 8))
        {
             const char* const parm = &argV[parmInd][8];

             if (!strcmp(parm, "on"))
                 gXMLDeclaration = true;
             else if (!strcmp(parm, "off"))
                 gXMLDeclaration = false;
             else
             {
                 std::cerr << "Unknown -wfdecl= value: " << parm << std::endl;
                 XMLPlatformUtils::Terminate();
                 return 2;
             }
        }
         else if (!strncmp(argV[parmInd], "-wbom=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
                gWriteBOM = true;
            else if (!strcmp(parm, "off"))
                gWriteBOM = false;
            else
            {
                std::cerr << "Unknown -wbom= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-xpath=", 7))
        {
             gXPathExpression = &(argV[parmInd][7]);
        }
         else
        {
            std::cerr << "Unknown option '" << argV[parmInd]
                 << "', ignoring it.\n" << std::endl;
        }
    }

    //
    //  And now we have to have only one parameter left and it must be
    //  the file name.
    //
    if (parmInd + 1 != argC)
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }
    gXmlFile = argV[parmInd];

    //
    //  Create our parser, then attach an error handler to the parser.
    //  The parser will call back to methods of the ErrorHandler if it
    //  discovers errors during the course of parsing the XML document.
    //
    XercesDOMParser *parser = new XercesDOMParser;
    parser->setValidationScheme(gValScheme);
    parser->setDoNamespaces(gDoNamespaces);
    parser->setDoSchema(gDoSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(gSchemaFullChecking);
    parser->setCreateEntityReferenceNodes(gDoCreate);

    DOMTreeErrorReporter *errReporter = new DOMTreeErrorReporter();
    parser->setErrorHandler(errReporter);

    //
    //  Parse the XML file, catching any XML exceptions that might propogate
    //  out of it.
    //
    bool errorsOccured = false;
    try
    {
        parser->parse(gXmlFile);
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException" << std::endl;
        errorsOccured = true;
    }
    catch (const XMLException& e)
    {
        std::cerr << "An error occurred during parsing\n   Message: "
             << StrX(e.getMessage()) << std::endl;
        errorsOccured = true;
    }

    catch (const DOMException& e)
    {
        const unsigned int maxChars = 2047;
        XMLCh errText[maxChars + 1];

        std::cerr << "\nDOM Error during parsing: '" << gXmlFile << "'\n"
             << "DOMException code is:  " << e.code << std::endl;

        if (DOMImplementation::loadDOMExceptionMsg(e.code, errText, maxChars))
             std::cerr << "Message is: " << StrX(errText) << std::endl;

        errorsOccured = true;
    }

    catch (...)
    {
        std::cerr << "An error occurred during parsing\n " << std::endl;
        errorsOccured = true;
    }

    // If the parse was successful, output the document data from the DOM tree
    if (!errorsOccured && !errReporter->getSawErrors())
    {
        DOMPrintFilter   *myFilter = 0;

        try
        {
            // get a serializer, an instance of DOMLSSerializer
            XMLCh tempStr[3] = {chLatin_L, chLatin_S, chNull};
            DOMImplementation *impl          = DOMImplementationRegistry::getDOMImplementation(tempStr);
            DOMLSSerializer   *theSerializer = ((DOMImplementationLS*)impl)->createLSSerializer();
            DOMLSOutput       *theOutputDesc = ((DOMImplementationLS*)impl)->createLSOutput();

            // set user specified output encoding
            theOutputDesc->setEncoding(gOutputEncoding);

            // plug in user's own filter
            if (gUseFilter)
            {
                // even we say to show attribute, but the DOMLSSerializer
                // will not show attribute nodes to the filter as
                // the specs explicitly says that DOMLSSerializer shall
                // NOT show attributes to DOMLSSerializerFilter.
                //
                // so DOMNodeFilter::SHOW_ATTRIBUTE has no effect.
                // same DOMNodeFilter::SHOW_DOCUMENT_TYPE, no effect.
                //
                myFilter = new DOMPrintFilter(DOMNodeFilter::SHOW_ELEMENT   |
                                              DOMNodeFilter::SHOW_ATTRIBUTE |
                                              DOMNodeFilter::SHOW_DOCUMENT_TYPE);
                theSerializer->setFilter(myFilter);
            }

            // plug in user's own error handler
            DOMErrorHandler *myErrorHandler = new DOMPrintErrorHandler();
            DOMConfiguration* serializerConfig=theSerializer->getDomConfig();
            serializerConfig->setParameter(XMLUni::fgDOMErrorHandler, myErrorHandler);

            // set feature if the serializer supports the feature/mode
            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTSplitCdataSections, gSplitCdataSections))
                serializerConfig->setParameter(XMLUni::fgDOMWRTSplitCdataSections, gSplitCdataSections);

            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTDiscardDefaultContent, gDiscardDefaultContent))
                serializerConfig->setParameter(XMLUni::fgDOMWRTDiscardDefaultContent, gDiscardDefaultContent);

            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTFormatPrettyPrint, gFormatPrettyPrint))
                serializerConfig->setParameter(XMLUni::fgDOMWRTFormatPrettyPrint, gFormatPrettyPrint);

            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTBOM, gWriteBOM))
                serializerConfig->setParameter(XMLUni::fgDOMWRTBOM, gWriteBOM);
            
            if (serializerConfig->canSetParameter(XMLUni::fgDOMXMLDeclaration, gXMLDeclaration))
                serializerConfig->setParameter(XMLUni::fgDOMXMLDeclaration, gXMLDeclaration);

            //
            // Plug in a format target to receive the resultant
            // XML stream from the serializer.
            //
            // StdOutFormatTarget prints the resultant XML stream
            // to stdout once it receives any thing from the serializer.
            //
            XMLFormatTarget *myFormTarget;
            if (goutputfile)
                myFormTarget=new LocalFileFormatTarget(goutputfile);
            else
                myFormTarget=new StdOutFormatTarget();
            theOutputDesc->setByteStream(myFormTarget);

            // get the DOM representation
            DOMDocument *doc = parser->getDocument();

            //
            // do the serialization through DOMLSSerializer::write();
            //
            if(gXPathExpression!=NULL)
            {
                XMLCh* xpathStr=XMLString::transcode(gXPathExpression);
                DOMElement* root = doc->getDocumentElement();
                try
                {
                    DOMXPathNSResolver* resolver=doc->createNSResolver(root);
                    DOMXPathResult* result=doc->evaluate(
                      xpathStr,
                      root,
                      resolver,
                      DOMXPathResult::ORDERED_NODE_SNAPSHOT_TYPE,
                      NULL);

                    XMLSize_t nLength = result->getSnapshotLength();
                    for(XMLSize_t i = 0; i < nLength; i++)
                    {
                      result->snapshotItem(i);
                      theSerializer->write(result->getNodeValue(), theOutputDesc);
                    }

                    result->release();
                    resolver->release ();
                }
                catch(const DOMXPathException& e)
                {
                    std::cerr << "An error occurred during processing of the XPath expression. Msg is:"
                        << std::endl
                        << StrX(e.getMessage()) << std::endl;
                    retval = 4;
                }
                catch(const DOMException& e)
                {
                    std::cerr << "An error occurred during processing of the XPath expression. Msg is:"
                        << std::endl
                        << StrX(e.getMessage()) << std::endl;
                    retval = 4;
                }
                XMLString::release(&xpathStr);
            }
            else
                theSerializer->write(doc, theOutputDesc);

            theOutputDesc->release();
            theSerializer->release();

            //
            // Filter, formatTarget and error handler
            // are NOT owned by the serializer.
            //
            delete myFormTarget;
            delete myErrorHandler;

            if (gUseFilter)
                delete myFilter;

        }
        catch (const OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            retval = 5;
        }
        catch (const DOMLSException& e)
        {
            std::cerr << "An error occurred during serialization of the DOM tree. Msg is:"
                << std::endl
                << StrX(e.getMessage()) << std::endl;
            retval = 4;
        }
        catch (const XMLException& e)
        {
            std::cerr << "An error occurred during creation of output transcoder. Msg is:"
                << std::endl
                << StrX(e.getMessage()) << std::endl;
            retval = 4;
        }

    }
    else
        retval = 4;

    //
    //  Clean up the error handler. The parser does not adopt handlers
    //  since they could be many objects or one object installed for multiple
    //  handlers.
    //
    delete errReporter;

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    XMLString::release(&gOutputEncoding);

    // And call the termination method
    XMLPlatformUtils::Terminate();

    return retval;
}